

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_assertion_handler.hpp
# Opt level: O0

void __thiscall
Catch::AssertionHandler::handleExpr<slang::syntax::MemberSyntax*&>
          (AssertionHandler *this,ExprLhs<slang::syntax::MemberSyntax_*&> *expr)

{
  AssertionHandler *in_RDI;
  ITransientExpression *in_stack_ffffffffffffffc8;
  
  ExprLhs<slang::syntax::MemberSyntax_*&>::makeUnaryExpr
            ((ExprLhs<slang::syntax::MemberSyntax_*&> *)in_stack_ffffffffffffffc8);
  handleExpr(in_RDI,in_stack_ffffffffffffffc8);
  return;
}

Assistant:

constexpr void handleExpr( ExprLhs<T> const& expr ) {
            handleExpr( expr.makeUnaryExpr() );
        }